

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

__pid_t __thiscall phosg::Subprocess::wait(Subprocess *this,void *__stat_loc)

{
  int *piVar1;
  runtime_error *this_00;
  uint *puVar2;
  int error;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  __pid_t local_20;
  byte local_19;
  int ret;
  bool poll_local;
  Subprocess *this_local;
  
  local_19 = (byte)__stat_loc & 1;
  _ret = this;
  if (this->exit_status < 0) {
    while (local_20 = waitpid(this->child_pid,&this->exit_status,(uint)((local_19 & 1) != 0)),
          local_20 == -1) {
      piVar1 = __errno_location();
      if (*piVar1 != 4) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        puVar2 = (uint *)__errno_location();
        string_for_error_abi_cxx11_(&local_60,(phosg *)(ulong)*puVar2,error);
        ::std::operator+(&local_40,"waitpid failed: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_60);
        ::std::runtime_error::runtime_error(this_00,(string *)&local_40);
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (local_20 == 0) {
      this_local._4_4_ = -1;
    }
    else {
      if (local_20 != this->child_pid) {
        __assert_fail("ret == this->child_pid",
                      "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/Process.cc"
                      ,0x1e0,"int phosg::Subprocess::wait(bool)");
      }
      this_local._4_4_ = this->exit_status;
    }
  }
  else {
    this_local._4_4_ = this->exit_status;
  }
  return this_local._4_4_;
}

Assistant:

int Subprocess::wait(bool poll) {
  if (this->exit_status >= 0) {
    return this->exit_status;
  }
  for (;;) {
    int ret = waitpid(this->child_pid, &this->exit_status, poll ? WNOHANG : 0);
    if (ret == -1) {
      if (errno != EINTR) {
        throw runtime_error("waitpid failed: " + string_for_error(errno));
      }
    } else if (ret == 0) {
      return -1; // not terminated yet
    } else {
      assert(ret == this->child_pid);
      return this->exit_status;
    }
  }
}